

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode calc_payload_hash(Curl_easy *data,uchar *sha_hash,char *sha_hex)

{
  uchar *input;
  CURLcode CVar1;
  size_t sStack_30;
  CURLcode result;
  size_t post_data_len;
  char *post_data;
  char *sha_hex_local;
  uchar *sha_hash_local;
  Curl_easy *data_local;
  
  input = (uchar *)(data->set).postfields;
  sStack_30 = 0;
  if (input != (uchar *)0x0) {
    if ((data->set).postfieldsize < 0) {
      sStack_30 = strlen((char *)input);
    }
    else {
      sStack_30 = (data->set).postfieldsize;
    }
  }
  CVar1 = Curl_sha256it(sha_hash,input,sStack_30);
  if (CVar1 == CURLE_OK) {
    sha256_to_hex(sha_hex,sha_hash);
  }
  return CVar1;
}

Assistant:

static CURLcode calc_payload_hash(struct Curl_easy *data,
                                  unsigned char *sha_hash, char *sha_hex)
{
  const char *post_data = data->set.postfields;
  size_t post_data_len = 0;
  CURLcode result;

  if(post_data) {
    if(data->set.postfieldsize < 0)
      post_data_len = strlen(post_data);
    else
      post_data_len = (size_t)data->set.postfieldsize;
  }
  result = Curl_sha256it(sha_hash, (const unsigned char *) post_data,
                         post_data_len);
  if(!result)
    sha256_to_hex(sha_hex, sha_hash);
  return result;
}